

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_wait_on_lock(Pager *pPager,int locktype)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  int rc;
  uint in_stack_ffffffffffffffec;
  int iVar2;
  
  iVar2 = -0x55555556;
  do {
    iVar2 = pagerLockDb((Pager *)CONCAT44(in_ESI,iVar2),in_stack_ffffffffffffffec);
    in_stack_ffffffffffffffec = in_stack_ffffffffffffffec & 0xffffff;
    if (iVar2 == 5) {
      iVar1 = (**(code **)(in_RDI + 0xe8))(*(undefined8 *)(in_RDI + 0xf0));
      in_stack_ffffffffffffffec = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffec);
    }
  } while ((char)(in_stack_ffffffffffffffec >> 0x18) != '\0');
  return iVar2;
}

Assistant:

static int pager_wait_on_lock(Pager *pPager, int locktype){
  int rc;                              /* Return code */

  /* Check that this is either a no-op (because the requested lock is
  ** already held), or one of the transitions that the busy-handler
  ** may be invoked during, according to the comment above
  ** sqlite3PagerSetBusyhandler().
  */
  assert( (pPager->eLock>=locktype)
       || (pPager->eLock==NO_LOCK && locktype==SHARED_LOCK)
       || (pPager->eLock==RESERVED_LOCK && locktype==EXCLUSIVE_LOCK)
  );

  do {
    rc = pagerLockDb(pPager, locktype);
  }while( rc==SQLITE_BUSY && pPager->xBusyHandler(pPager->pBusyHandlerArg) );
  return rc;
}